

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_node.c
# Opt level: O0

int mpt_parse_node(mpt_node *root,mpt_parser_context *parse,char *fmt)

{
  int fmt_00;
  mpt_input_parser_t next_00;
  int err;
  mpt_input_parser_t next;
  mpt_parser_format pfmt;
  mpt_node *curr;
  mpt_node conf;
  char *fmt_local;
  mpt_parser_context *parse_local;
  mpt_node *root_local;
  
  conf.ident._base = fmt;
  memset(&curr,0,0x38);
  conf.children._3_1_ = 0xc;
  pfmt._4_8_ = &curr;
  if ((root == (mpt_node *)0x0) || (parse == (mpt_parser_context *)0x0)) {
    root_local._4_4_ = -1;
  }
  else {
    fmt_00 = mpt_parse_format((mpt_parser_format *)((long)&next + 4),conf.ident._base);
    next_00 = mpt_parse_next_fcn(fmt_00);
    if (next_00 == (mpt_input_parser_t)0x0) {
      root_local._4_4_ = -3;
    }
    else {
      parse->prev = '\x01';
      root_local._4_4_ =
           mpt_parse_config(next_00,(void *)((long)&next + 4),parse,saveAppend,&pfmt.oend);
      if (root_local._4_4_ < 0) {
        mpt_node_clear((mpt_node *)&curr);
      }
      else if (root->children == (mpt_node *)0x0) {
        root->children = conf.parent;
      }
      else if (conf.parent != (mpt_node *)0x0) {
        mpt_node_move(&root->children,conf.parent);
        mpt_node_clear(root);
        pfmt._4_8_ = conf.parent;
        root->children = conf.parent;
        for (; pfmt._4_8_ != 0; pfmt._4_8_ = *(undefined8 *)(pfmt._4_8_ + 8)) {
          *(mpt_node **)(pfmt._4_8_ + 0x18) = root;
        }
      }
    }
  }
  return root_local._4_4_;
}

Assistant:

extern int mpt_parse_node(MPT_STRUCT(node) *root, MPT_STRUCT(parser_context) *parse, const char *fmt)
{
	MPT_STRUCT(node) conf = MPT_NODE_INIT;
	MPT_STRUCT(node) *curr = &conf;
	MPT_STRUCT(parser_format) pfmt;
	MPT_TYPE(input_parser) next;
	int err;
	
	if (!root || !parse) {
		return MPT_ERROR(BadArgument);
	}
	err = mpt_parse_format(&pfmt, fmt);
	
	if (!(next = mpt_parse_next_fcn(err))) {
		return MPT_ERROR(BadType);
	}
	parse->prev = MPT_PARSEFLAG(Section);
	
	err = mpt_parse_config(next, &pfmt, parse, saveAppend, &curr);
	
	/* clear created nodes on error */
	if (err < 0) {
		mpt_node_clear(&conf);
		return err;
	}
	
	/* create new nodes */
	if (!(root->children)) {
		root->children = conf.children;
	}
	/* add to existing */
	else if (conf.children) {
		/* move/set non-present entries */
		mpt_node_move(&root->children, conf.children);
		/* clear remaining/superseeded entries */
		mpt_node_clear(root);
		/* replave tree with merged data */
		root->children = curr = conf.children;
		/* set parent for moved nodes */
		while (curr) {
			curr->parent = root;
			curr = curr->next;
		}
	}
	return err;
}